

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ret0.cxx
# Opt level: O1

int main(int ac,char **av)

{
  bool bVar1;
  uint uVar2;
  char **ppcVar3;
  long lVar4;
  char *pcVar5;
  undefined8 uVar6;
  ulong uVar7;
  bool bVar8;
  string logfile;
  string logarg;
  string arg;
  string exename;
  CommandLineArguments args;
  int local_118;
  string local_110;
  undefined1 *local_f0;
  char *local_e8;
  undefined1 local_e0;
  undefined7 uStack_df;
  long *local_d0 [2];
  long local_c0 [2];
  char *local_b0;
  long local_a8;
  undefined8 local_a0;
  long local_98;
  ulong local_90;
  long *local_88 [2];
  long local_78 [2];
  CommandLineArguments local_68;
  long *local_50 [2];
  long local_40 [2];
  
  cmsys::Encoding::CommandLineArguments::Main(&local_68,ac,av);
  uVar2 = cmsys::Encoding::CommandLineArguments::argc(&local_68);
  ppcVar3 = cmsys::Encoding::CommandLineArguments::argv(&local_68);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_88,*ppcVar3,(allocator<char> *)&local_f0);
  local_f0 = &local_e0;
  local_e8 = (char *)0x0;
  local_e0 = 0;
  lVar4 = std::__cxx11::string::find((char *)local_88,0x110004,0);
  if (lVar4 == -1) {
    lVar4 = std::__cxx11::string::find((char *)local_88,0x110019,0);
    if (lVar4 != -1) {
      pcVar5 = "-log-file=";
      goto LAB_00104ab9;
    }
    uVar6 = 0;
    lVar4 = std::__cxx11::string::find((char *)local_88,0x110020,0);
    if (lVar4 != -1) {
      uVar6 = 1;
      std::__cxx11::string::_M_replace((ulong)&local_f0,0,local_e8,0x110023);
    }
  }
  else {
    pcVar5 = "--log-file=";
LAB_00104ab9:
    uVar6 = 0;
    std::__cxx11::string::_M_replace((ulong)&local_f0,0,local_e8,(ulong)pcVar5);
  }
  if (local_e8 != (char *)0x0) {
    local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
    local_110._M_string_length = 0;
    local_110.field_2._M_local_buf[0] = '\0';
    bVar8 = 1 < (int)uVar2;
    if ((int)uVar2 < 2) {
      local_118 = 0;
    }
    else {
      local_90 = (ulong)uVar2;
      local_a8 = 1 - (ulong)(uVar2 - 1);
      local_98 = 1 - local_90;
      local_118 = 0;
      uVar7 = 2;
      local_a0 = uVar6;
      do {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_d0,ppcVar3[uVar7 - 1],(allocator<char> *)local_50);
        lVar4 = std::__cxx11::string::find((char *)local_d0,(ulong)local_f0,0);
        bVar1 = true;
        if (lVar4 == 0) {
          if ((char)local_a0 == '\0') {
            std::__cxx11::string::substr((ulong)local_50,(ulong)local_d0);
            std::__cxx11::string::operator=((string *)&local_110,(string *)local_50);
            if (local_50[0] != local_40) {
              operator_delete(local_50[0],local_40[0] + 1);
            }
          }
          else if (local_a8 + uVar7 == 2) {
            local_118 = 1;
            bVar1 = false;
          }
          else {
            pcVar5 = ppcVar3[uVar7];
            local_b0 = (char *)local_110._M_string_length;
            strlen(pcVar5);
            std::__cxx11::string::_M_replace((ulong)&local_110,0,local_b0,(ulong)pcVar5);
          }
        }
        if (local_d0[0] != local_c0) {
          operator_delete(local_d0[0],local_c0[0] + 1);
        }
        if (!bVar1) break;
        bVar8 = uVar7 < local_90;
        lVar4 = local_98 + uVar7;
        uVar7 = uVar7 + 1;
      } while (lVar4 != 1);
    }
    if (bVar8) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_dataplus._M_p != &local_110.field_2) {
        operator_delete(local_110._M_dataplus._M_p,
                        CONCAT71(local_110.field_2._M_allocated_capacity._1_7_,
                                 local_110.field_2._M_local_buf[0]) + 1);
      }
      goto LAB_00104cdd;
    }
    if ((char *)local_110._M_string_length != (char *)0x0) {
      cmsys::SystemTools::Touch(&local_110,true);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p,
                      CONCAT71(local_110.field_2._M_allocated_capacity._1_7_,
                               local_110.field_2._M_local_buf[0]) + 1);
    }
  }
  local_118 = 0;
LAB_00104cdd:
  if (local_f0 != &local_e0) {
    operator_delete(local_f0,CONCAT71(uStack_df,local_e0) + 1);
  }
  if (local_88[0] != local_78) {
    operator_delete(local_88[0],local_78[0] + 1);
  }
  cmsys::Encoding::CommandLineArguments::~CommandLineArguments(&local_68);
  return local_118;
}

Assistant:

int main(int ac, char** av)
{
  cmsys::Encoding::CommandLineArguments args =
    cmsys::Encoding::CommandLineArguments::Main(ac, av);
  int argc = args.argc();
  const char* const* argv = args.argv();

  std::string exename = argv[0];
  std::string logarg;
  bool nextarg = false;

  if (exename.find("valgrind") != std::string::npos) {
    logarg = "--log-file=";
  } else if (exename.find("purify") != std::string::npos) {
#ifdef _WIN32
    logarg = "/SAVETEXTDATA=";
#else
    logarg = "-log-file=";
#endif
  } else if (exename.find("BC") != std::string::npos) {
    nextarg = true;
    logarg = "/X";
  }

  if (!logarg.empty()) {
    std::string logfile;
    for (int i = 1; i < argc; i++) {
      std::string arg = argv[i];
      if (arg.find(logarg) == 0) {
        if (nextarg) {
          if (i == argc - 1) {
            return 1; // invalid command line
          }
          logfile = argv[i + 1];
        } else {
          logfile = arg.substr(logarg.length());
        }
        // keep searching, it may be overridden later to provoke an error
      }
    }

    if (!logfile.empty()) {
      cmSystemTools::Touch(logfile, true);
    }
  }

  return RETVAL;
}